

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O3

int __thiscall
FNodeBuilder::CloseSubsector
          (FNodeBuilder *this,TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *segs,
          int subsector,vertex_t *outVerts)

{
  FPrivSeg *pFVar1;
  side_t **ppsVar2;
  sector_t **ppsVar3;
  int iVar4;
  int iVar5;
  subsector_t *psVar6;
  seg_t *psVar7;
  USegPtr *pUVar8;
  FPrivVert *pFVar9;
  glseg_t *pgVar10;
  DWORD DVar11;
  uint uVar12;
  angle_t aVar13;
  int iVar14;
  FPrivSeg *pFVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  FPrivSeg *pFVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  bool bVar23;
  uint uVar24;
  uint uVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  FPrivSeg *local_78;
  angle_t local_6c;
  FPrivSeg *local_40;
  seg_t *local_38;
  
  psVar6 = (this->Subsectors).Array;
  pFVar19 = (this->Segs).Array;
  psVar7 = psVar6[subsector].firstline;
  uVar12 = psVar6[subsector].numlines;
  uVar22 = uVar12 + (uint)psVar7;
  pUVar8 = (this->SegList).Array;
  uVar25 = pUVar8[(ulong)psVar7 & 0xffffffff].SegNum;
  local_78 = pFVar19 + uVar25;
  pFVar9 = (this->Vertices).Array;
  if ((uint)psVar7 < uVar22) {
    uVar21 = (ulong)psVar7 & 0xffffffff;
    dVar26 = 0.0;
    dVar27 = 0.0;
    bVar23 = false;
    do {
      uVar24 = pUVar8[uVar21].SegNum;
      dVar26 = dVar26 + (double)pFVar9[pFVar19[uVar24].v2].super_FSimpleVert.x +
                        (double)pFVar9[pFVar19[uVar24].v1].super_FSimpleVert.x;
      dVar27 = dVar27 + (double)pFVar9[pFVar19[uVar24].v2].super_FSimpleVert.y +
                        (double)pFVar9[pFVar19[uVar24].v1].super_FSimpleVert.y;
      bVar23 = (bool)(bVar23 | pFVar19[uVar25].planenum != pFVar19[uVar24].planenum);
      uVar21 = uVar21 + 1;
    } while (uVar22 != uVar21);
  }
  else {
    bVar23 = false;
    dVar26 = 0.0;
    dVar27 = 0.0;
  }
  dVar28 = (double)uVar12;
  iVar16 = (int)((dVar26 / dVar28) * 0.5);
  iVar20 = (int)((dVar27 / dVar28) * 0.5);
  local_6c = PointToAngle(pFVar9[local_78->v1].super_FSimpleVert.x - iVar16,
                          pFVar9[local_78->v1].super_FSimpleVert.y - iVar20);
  DVar11 = PushGLSeg(this,segs,local_78,outVerts);
  local_78->storedseg = DVar11;
  iVar4 = local_78->v1;
  local_40 = local_78;
  if (bVar23) {
    iVar18 = 1;
    uVar21 = (ulong)psVar7 & 0xffffffff;
    local_38 = psVar7;
    do {
      uVar12 = (int)uVar21 + 1;
      pFVar19 = local_78;
      if (uVar22 <= uVar12) break;
      uVar21 = (ulong)local_38 & 0xffffffff;
      pFVar19 = (FPrivSeg *)0x0;
      uVar25 = 0xffffffff;
      do {
        pFVar9 = (this->Vertices).Array;
        pFVar1 = (this->Segs).Array + (this->SegList).Array[uVar21].SegNum;
        aVar13 = PointToAngle(pFVar9[pFVar1->v1].super_FSimpleVert.x - iVar16,
                              pFVar9[pFVar1->v1].super_FSimpleVert.y - iVar20);
        uVar24 = local_6c - aVar13;
        pFVar15 = pFVar1;
        iVar14 = pFVar1->v1;
        if (pFVar1->v1 == local_78->v2) break;
        if (uVar25 <= uVar24 || uVar24 == 0) {
          pFVar15 = pFVar19;
          uVar24 = uVar25;
        }
        uVar17 = (int)uVar21 + 1;
        uVar21 = (ulong)uVar17;
        pFVar19 = pFVar15;
        iVar14 = local_78->v2;
        uVar25 = uVar24;
      } while (uVar17 < uVar22);
      local_78 = pFVar1;
      if (pFVar15 != (FPrivSeg *)0x0) {
        local_78 = pFVar15;
      }
      iVar5 = local_78->v1;
      if (iVar14 != iVar5) {
        TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::Grow(segs,1);
        pgVar10 = segs->Array;
        uVar25 = segs->Count;
        pgVar10[uVar25].super_seg_t.v1 = outVerts + iVar14;
        pgVar10[uVar25].super_seg_t.v2 = outVerts + iVar5;
        ppsVar2 = &pgVar10[uVar25].super_seg_t.sidedef;
        *ppsVar2 = (side_t *)0x0;
        ppsVar2[1] = (side_t *)0x0;
        ppsVar3 = &pgVar10[uVar25].super_seg_t.frontsector;
        *ppsVar3 = (sector_t *)0x0;
        ppsVar3[1] = (sector_t *)0x0;
        pgVar10[uVar25].Partner = 0xffffffff;
        segs->Count = segs->Count + 1;
        iVar18 = iVar18 + 1;
      }
      local_6c = local_6c - uVar24;
      DVar11 = PushGLSeg(this,segs,local_78,outVerts);
      local_78->storedseg = DVar11;
      iVar18 = iVar18 + 1;
      uVar21 = (ulong)uVar12;
      pFVar19 = local_78;
    } while (local_78->v2 != iVar4);
  }
  else {
    iVar16 = OutputDegenerateSubsector(this,segs,subsector,true,0.0,&local_40,outVerts);
    iVar20 = OutputDegenerateSubsector
                       (this,segs,subsector,false,1.79769313486232e+308,&local_40,outVerts);
    iVar18 = OutputDegenerateSubsector
                       (this,segs,subsector,true,-1.79769313486232e+308,&local_40,outVerts);
    iVar18 = iVar18 + iVar20 + iVar16 + 1;
    pFVar19 = local_40;
  }
  local_40 = pFVar19;
  iVar16 = local_40->v2;
  if (iVar16 != iVar4) {
    TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::Grow(segs,1);
    pgVar10 = segs->Array;
    uVar12 = segs->Count;
    pgVar10[uVar12].super_seg_t.v1 = outVerts + iVar16;
    pgVar10[uVar12].super_seg_t.v2 = outVerts + iVar4;
    ppsVar2 = &pgVar10[uVar12].super_seg_t.sidedef;
    *ppsVar2 = (side_t *)0x0;
    ppsVar2[1] = (side_t *)0x0;
    ppsVar3 = &pgVar10[uVar12].super_seg_t.frontsector;
    *ppsVar3 = (sector_t *)0x0;
    ppsVar3[1] = (sector_t *)0x0;
    pgVar10[uVar12].Partner = 0xffffffff;
    segs->Count = segs->Count + 1;
    iVar18 = iVar18 + 1;
  }
  return iVar18;
}

Assistant:

int FNodeBuilder::CloseSubsector (TArray<glseg_t> &segs, int subsector, vertex_t *outVerts)
{
	FPrivSeg *seg, *prev;
	angle_t prevAngle;
	double accumx, accumy;
	fixed_t midx, midy;
	int firstVert;
	DWORD first, max, count, i, j;
	bool diffplanes;
	int firstplane;

	first = (DWORD)(size_t)Subsectors[subsector].firstline;
	max = first + Subsectors[subsector].numlines;
	count = 0;

	accumx = accumy = 0.0;
	diffplanes = false;
	firstplane = Segs[SegList[first].SegNum].planenum;

	// Calculate the midpoint of the subsector and also check for degenerate subsectors.
	// A subsector is degenerate if it exists in only one dimension, which can be
	// detected when all the segs lie in the same plane. This can happen if you have
	// outward-facing lines in the void that don't point toward any sector. (Some of the
	// polyobjects in Hexen are constructed like this.)
	for (i = first; i < max; ++i)
	{
		seg = &Segs[SegList[i].SegNum];
		accumx += double(Vertices[seg->v1].x) + double(Vertices[seg->v2].x);
		accumy += double(Vertices[seg->v1].y) + double(Vertices[seg->v2].y);
		if (firstplane != seg->planenum)
		{
			diffplanes = true;
		}
	}

	midx = fixed_t(accumx / (max - first) / 2);
	midy = fixed_t(accumy / (max - first) / 2);

	seg = &Segs[SegList[first].SegNum];
	prevAngle = PointToAngle (Vertices[seg->v1].x - midx, Vertices[seg->v1].y - midy);
	seg->storedseg = PushGLSeg (segs, seg, outVerts);
	count = 1;
	prev = seg;
	firstVert = seg->v1;

#ifdef DD
	Printf(PRINT_LOG, "--%d--\n", subsector);
	for (j = first; j < max; ++j)
	{
		seg = &Segs[SegList[j].SegNum];
		angle_t ang = PointToAngle (Vertices[seg->v1].x - midx, Vertices[seg->v1].y - midy);
		Printf(PRINT_LOG, "%d%c %5d(%5d,%5d)->%5d(%5d,%5d) - %3.5f  %d,%d  [%08x,%08x]-[%08x,%08x]\n", j,
			seg->linedef == -1 ? '+' : ':',
			seg->v1, Vertices[seg->v1].x>>16, Vertices[seg->v1].y>>16,
			seg->v2, Vertices[seg->v2].x>>16, Vertices[seg->v2].y>>16,
			double(ang/2)*180/(1<<30),
			seg->planenum, seg->planefront,
			Vertices[seg->v1].x, Vertices[seg->v1].y,
			Vertices[seg->v2].x, Vertices[seg->v2].y);
	}
#endif

	if (diffplanes)
	{ // A well-behaved subsector. Output the segs sorted by the angle formed by connecting
	  // the subsector's center to their first vertex.

		D(Printf(PRINT_LOG, "Well behaved subsector\n"));
		for (i = first + 1; i < max; ++i)
		{
			angle_t bestdiff = ANGLE_MAX;
			FPrivSeg *bestseg = NULL;
			DWORD bestj = DWORD_MAX;
			j = first;
			do
			{
				seg = &Segs[SegList[j].SegNum];
				angle_t ang = PointToAngle (Vertices[seg->v1].x - midx, Vertices[seg->v1].y - midy);
				angle_t diff = prevAngle - ang;
				if (seg->v1 == prev->v2)
				{
					bestdiff = diff;
					bestseg = seg;
					bestj = j;
					break;
				}
				if (diff < bestdiff && diff > 0)
				{
					bestdiff = diff;
					bestseg = seg;
					bestj = j;
				}
			}
			while (++j < max);
			// Is a NULL bestseg actually okay?
			if (bestseg != NULL)
			{
				seg = bestseg;
			}
			if (prev->v2 != seg->v1)
			{
				// Add a new miniseg to connect the two segs
				PushConnectingGLSeg (subsector, segs, &outVerts[prev->v2], &outVerts[seg->v1]);
				count++;
			}
#ifdef DD
			Printf(PRINT_LOG, "+%d\n", bestj);
#endif
			prevAngle -= bestdiff;
			seg->storedseg = PushGLSeg (segs, seg, outVerts);
			count++;
			prev = seg;
			if (seg->v2 == firstVert)
			{
				prev = seg;
				break;
			}
		}
#ifdef DD
		Printf(PRINT_LOG, "\n");
#endif
	}
	else
	{ // A degenerate subsector. These are handled in three stages:
	  // Stage 1. Proceed in the same direction as the start seg until we
	  //          hit the seg furthest from it.
	  // Stage 2. Reverse direction and proceed until we hit the seg
	  //          furthest from the start seg.
	  // Stage 3. Reverse direction again and insert segs until we get
	  //          to the start seg.
	  // A dot product serves to determine distance from the start seg.

		D(Printf(PRINT_LOG, "degenerate subsector\n"));

		// Stage 1. Go forward.
		count += OutputDegenerateSubsector (segs, subsector, true, 0, prev, outVerts);

		// Stage 2. Go backward.
		count += OutputDegenerateSubsector (segs, subsector, false, DBL_MAX, prev, outVerts);

		// Stage 3. Go forward again.
		count += OutputDegenerateSubsector (segs, subsector, true, -DBL_MAX, prev, outVerts);
	}

	if (prev->v2 != firstVert)
	{
		PushConnectingGLSeg (subsector, segs, &outVerts[prev->v2], &outVerts[firstVert]);
		count++;
	}
#ifdef DD
	Printf(PRINT_LOG, "Output GL subsector %d:\n", subsector);
	for (i = segs.Size() - count; i < (int)segs.Size(); ++i)
	{
		Printf(PRINT_LOG, "  Seg %5d%c(%5d,%5d)-(%5d,%5d)  [%08x,%08x]-[%08x,%08x]\n", i,
			segs[i].linedef == NULL ? '+' : ' ',
			segs[i].v1->fixX()>>16,
			segs[i].v1->fixY()>>16,
			segs[i].v2->fixX()>>16,
			segs[i].v2->fixY()>>16,
			segs[i].v1->fixX(),
			segs[i].v1->fixY(),
			segs[i].v2->fixX(),
			segs[i].v2->fixY());
	}
#endif

	return count;
}